

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::startSendingMessages(FtpSession *this)

{
  ostream *poVar1;
  reference pvVar2;
  enable_shared_from_this<fineftp::FtpSession> local_50;
  wrapped_handler<asio::io_context::strand,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:90:23),_asio::detail::is_continuation_if_running>
  local_40;
  mutable_buffer local_20;
  FtpSession *local_10;
  FtpSession *this_local;
  
  local_10 = this;
  poVar1 = ::std::operator<<((ostream *)&::std::cout,"FTP >> ");
  pvVar2 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(&this->command_output_queue_);
  poVar1 = ::std::operator<<(poVar1,(string *)pvVar2);
  ::std::ostream::operator<<(poVar1,::std::endl<char,std::char_traits<char>>);
  pvVar2 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::front(&this->command_output_queue_);
  local_20 = (mutable_buffer)
             asio::buffer<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pvVar2)
  ;
  std::enable_shared_from_this<fineftp::FtpSession>::shared_from_this(&local_50);
  asio::io_context::strand::wrap<fineftp::FtpSession::startSendingMessages()::__0>
            (&local_40,&this->command_write_strand_,(anon_class_16_1_3fcf6656 *)&local_50);
  asio::
  async_write<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::detail::wrapped_handler<asio::io_context::strand,fineftp::FtpSession::startSendingMessages()::__0,asio::detail::is_continuation_if_running>>
            (&this->command_socket_,(mutable_buffers_1 *)&local_20,&local_40,(type *)0x0);
  asio::detail::
  wrapped_handler<asio::io_context::strand,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:90:23),_asio::detail::is_continuation_if_running>
  ::~wrapped_handler(&local_40);
  startSendingMessages()::$_0::~__0((__0 *)&local_50);
  return;
}

Assistant:

void FtpSession::startSendingMessages()
  {
#ifndef NDEBUG
    std::cout << "FTP >> " << command_output_queue_.front() << std::endl;
#endif

    asio::async_write(command_socket_
                    , asio::buffer(command_output_queue_.front())
                    , command_write_strand_.wrap(
                      [me = shared_from_this()](asio::error_code ec, std::size_t /*bytes_to_transfer*/)
                      {
                        if (!ec)
                        {
                          me->command_output_queue_.pop_front();
              
                          if (!me->command_output_queue_.empty())
                          {
                            me->startSendingMessages();
                          }
                        }
                        else
                        {
                          std::cerr << "Command write error: " << ec.message() << std::endl;
                        }
                      }
                    ));
  }